

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

bool duckdb::AllowUnredactedSecretsSetting::OnGlobalReset(DatabaseInstance *db,DBConfig *config)

{
  InvalidInputException *this;
  string local_40;
  
  if (db == (DatabaseInstance *)0x0) {
    return true;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "Cannot change allow_unredacted_secrets setting while database is running","");
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool AllowUnredactedSecretsSetting::OnGlobalReset(DatabaseInstance *db, DBConfig &config) {
	if (db) {
		throw InvalidInputException("Cannot change allow_unredacted_secrets setting while database is running");
	}
	return true;
}